

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void array_uc(void)

{
  uchar s [4];
  stringstream ss;
  uchar local_1c4 [4];
  Assert local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  local_1c4[0] = '\0';
  local_1c4[1] = '\x01';
  local_1c4[2] = '\x02';
  local_1c4[3] = 0x9c;
  std::__cxx11::stringstream::stringstream(local_190);
  local_1b0._M_dataplus._M_p = (pointer)local_1c4;
  UnitTests::stream_any_details::operator<<(local_180,(outputter<unsigned_char[4]> *)&local_1b0);
  local_1c0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1c0.m_line = 199;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[25],std::__cxx11::string>
            (&local_1c0,(char (*) [25])"[0x00, 0x01, 0x02, 0x9c]",&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(array_uc)
{
    unsigned char s[]{0, 1, 2, 156};
    auto          ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0x00, 0x01, 0x02, 0x9c]", ss.str());
}